

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void immutable::rrb_details::release<char>(internal_node<char,_false> *p_node)

{
  uint32_t uVar1;
  internal_node<char,_false> *piVar2;
  uint local_14;
  uint32_t i;
  internal_node<char,_false> *p_node_local;
  
  if ((p_node != (internal_node<char,_false> *)0x0) &&
     (uVar1 = p_node->_ref_count, p_node->_ref_count = uVar1 - 1, uVar1 == 1)) {
    ref<immutable::rrb_details::rrb_size_table<false>_>::dec(&p_node->size_table);
    for (local_14 = 0; local_14 < p_node->len; local_14 = local_14 + 1) {
      if ((p_node->child[local_14].ptr == (internal_node<char,_false> *)0x0) ||
         (piVar2 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                             (p_node->child + local_14), piVar2->type != LEAF_NODE)) {
        release<char>(p_node->child[local_14].ptr);
      }
      else {
        release<char>((leaf_node<char,_false> *)p_node->child[local_14].ptr);
      }
    }
    free(p_node);
  }
  return;
}

Assistant:

inline void release(const internal_node<T, false>* p_node)
      {
      if (p_node)
        {
        if (1 == p_node->_ref_count--)
          {
          p_node->size_table.dec();
          for (uint32_t i = 0; i < p_node->len; ++i)
            {
            if (p_node->child[i].ptr && p_node->child[i]->type == LEAF_NODE)
              {
              release((leaf_node<T, false>*)p_node->child[i].ptr);
              }
            else
              release(p_node->child[i].ptr);
            }
          free((void*)p_node);
          }
        }
      }